

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_end.c
# Opt level: O0

void arg_end_errorfn(void *parent,arg_dstr_t ds,int error,char *argval,char *progname)

{
  char *local_40;
  char *local_38;
  char *progname_local;
  char *argval_local;
  int error_local;
  arg_dstr_t ds_local;
  void *parent_local;
  
  local_38 = progname;
  if (progname == (char *)0x0) {
    local_38 = "";
  }
  local_40 = argval;
  if (argval == (char *)0x0) {
    local_40 = "";
  }
  arg_dstr_catf(ds,"%s: ",local_38);
  switch(error) {
  case 1:
    arg_dstr_cat(ds,"too many errors to display");
    break;
  case 2:
    arg_dstr_cat(ds,"insufficient memory");
    break;
  case 3:
    arg_dstr_catf(ds,"unexpected argument \"%s\"",local_40);
    break;
  case 4:
    arg_dstr_catf(ds,"invalid option \"%s\"",local_40);
    break;
  case 5:
    arg_dstr_catf(ds,"option \"%s\" requires an argument",local_40);
    break;
  default:
    arg_dstr_catf(ds,"invalid option \"-%c\"",(ulong)(uint)error);
  }
  arg_dstr_cat(ds,"\n");
  return;
}

Assistant:

static void arg_end_errorfn(void* parent, arg_dstr_t ds, int error, const char* argval, const char* progname) {
    /* suppress unreferenced formal parameter warning */
    (void)parent;

    progname = progname ? progname : "";
    argval = argval ? argval : "";

    arg_dstr_catf(ds, "%s: ", progname);
    switch (error) {
        case ARG_ELIMIT:
            arg_dstr_cat(ds, "too many errors to display");
            break;
        case ARG_EMALLOC:
            arg_dstr_cat(ds, "insufficient memory");
            break;
        case ARG_ENOMATCH:
            arg_dstr_catf(ds, "unexpected argument \"%s\"", argval);
            break;
        case ARG_EMISSARG:
            arg_dstr_catf(ds, "option \"%s\" requires an argument", argval);
            break;
        case ARG_ELONGOPT:
            arg_dstr_catf(ds, "invalid option \"%s\"", argval);
            break;
        default:
            arg_dstr_catf(ds, "invalid option \"-%c\"", error);
            break;
    }

    arg_dstr_cat(ds, "\n");
}